

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RSA.h
# Opt level: O0

void __thiscall RSA::print_vocabulary(RSA *this)

{
  ostream *this_00;
  allocator local_31;
  string local_30 [32];
  RSA *local_10;
  RSA *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"Vocabulary",&local_31);
  Crypto::print_header(&this->super_Crypto,(string *)local_30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  this_00 = std::operator<<((ostream *)&std::cout,(string *)&(this->super_Crypto).vocabulary);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void RSA::print_vocabulary() {
    print_header("Vocabulary");
    cout << vocabulary << endl;

}